

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointActionDiscrete.cpp
# Opt level: O2

void __thiscall JointActionDiscrete::~JointActionDiscrete(JointActionDiscrete *this)

{
  pointer ppAVar1;
  
  (this->super_JointAction)._vptr_JointAction = (_func_int **)&PTR__JointActionDiscrete_006069e0;
  (this->super_DiscreteEntity)._vptr_DiscreteEntity =
       (_func_int **)&PTR__JointActionDiscrete_00606a28;
  ppAVar1 = (this->_m_apVector).
            super__Vector_base<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_m_apVector).
      super__Vector_base<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppAVar1) {
    (this->_m_apVector).
    super__Vector_base<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppAVar1;
  }
  std::_Vector_base<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>::~_Vector_base
            (&(this->_m_apVector).
              super__Vector_base<const_ActionDiscrete_*,_std::allocator<const_ActionDiscrete_*>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->_m_aIndexVector).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

JointActionDiscrete::~JointActionDiscrete()
{
if(DEBUG_JAD) cout << "deleting joint action";

/*  Do not delete the individual actions that are pointed to (there is only
 *  one copy of those, so that will lead to segfaults)
    for(Index i=0; i<_m_apVector.size(); i++) 
        delete _m_apVector[i];*/

    _m_apVector.clear();
}